

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field_operators.cpp
# Opt level: O0

void __thiscall Field_operators_properties::test_method(Field_operators_properties *this)

{
  Z2_field_operators *this_00;
  undefined1 local_38 [8];
  Zp_field_operators<unsigned_int,_void> zpop;
  Z2_field_operators z2op;
  Field_operators_properties *this_local;
  
  this_00 = (Z2_field_operators *)
            ((long)&zpop.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  Gudhi::persistence_fields::Z2_field_operators::Z2_field_operators(this_00);
  test_z2_standart_field_properties<Gudhi::persistence_fields::Z2_field_operators>(this_00);
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::Zp_field_operators
            ((Zp_field_operators<unsigned_int,_void> *)local_38,0);
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::set_characteristic
            ((Zp_field_operators<unsigned_int,_void> *)local_38,2);
  test_z2_standart_field_properties<Gudhi::persistence_fields::Zp_field_operators<unsigned_int,void>>
            ((Zp_field_operators<unsigned_int,_void> *)local_38);
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::set_characteristic
            ((Zp_field_operators<unsigned_int,_void> *)local_38,5);
  test_z5_standart_field_properties<Gudhi::persistence_fields::Zp_field_operators<unsigned_int,void>>
            ((Zp_field_operators<unsigned_int,_void> *)local_38);
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::set_characteristic
            ((Zp_field_operators<unsigned_int,_void> *)local_38,7);
  test_z7_standart_field_properties<Gudhi::persistence_fields::Zp_field_operators<unsigned_int,void>>
            ((Zp_field_operators<unsigned_int,_void> *)local_38);
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::~Zp_field_operators
            ((Zp_field_operators<unsigned_int,_void> *)local_38);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(Field_operators_properties) {
  Z2_field_operators z2op;
  test_z2_standart_field_properties(z2op);

  Zp_field_operators zpop;
  zpop.set_characteristic(2);
  test_z2_standart_field_properties(zpop);
  zpop.set_characteristic(5);
  test_z5_standart_field_properties(zpop);
  zpop.set_characteristic(7);
  test_z7_standart_field_properties(zpop);
}